

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::applyDiagnosticPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  Token *this_00;
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  Info *pIVar4;
  SyntaxNode *pSVar5;
  SimplePragmaExpressionSyntax *pSVar6;
  SourceLocation SVar7;
  NameValuePragmaExpressionSyntax *pNVar8;
  Diagnostic *this_01;
  PragmaExpressionSyntax *pPVar9;
  ParenPragmaExpressionSyntax *pPVar10;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *pSVar11;
  char *pcVar12;
  SourceManager *this_02;
  not_null<slang::syntax::PragmaExpressionSyntax_*> *this_03;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *pSVar13;
  string_view sVar14;
  SourceRange SVar15;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  size_t sStack_90;
  DiagnosticSeverity severity;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *local_78;
  Preprocessor *local_70;
  iterator __begin6;
  Token last;
  anon_class_16_2_8b023938 setDirective;
  
  sVar1 = (pragma->args).elements.size_;
  if (sVar1 == 0) {
    last = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar7 = Token::location(&last);
    sVar14 = Token::rawText(&last);
    addDiag(this,(DiagCode)0x1d0004,(SourceLocation)((long)SVar7 + sVar14._M_len * 0x10000000));
  }
  else {
    pSVar13 = &pragma->args;
    last.info = (Info *)0x0;
    last._0_8_ = pSVar13;
    pIVar4 = (Info *)0x0;
    pSVar11 = pSVar13;
    local_78 = pSVar13;
    local_70 = this;
    while ((pSVar11 != pSVar13 || (pIVar4 != (Info *)(sVar1 + 1 >> 1)))) {
      pSVar5 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*
                          ((iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)&last)->
                super_SyntaxNode;
      if (pSVar5->kind == NameValuePragmaExpression) {
        pNVar8 = slang::syntax::SyntaxNode::as<slang::syntax::NameValuePragmaExpressionSyntax>
                           (pSVar5);
        sVar14 = Token::valueText(&pNVar8->name);
        __y_00._M_str = "ignore";
        __y_00._M_len = 6;
        bVar3 = std::operator==(sVar14,__y_00);
        if (bVar3) {
          severity = Ignored;
        }
        else {
          __y_01._M_str = "warn";
          __y_01._M_len = 4;
          bVar3 = std::operator==(sVar14,__y_01);
          if (bVar3) {
            severity = Warning;
          }
          else {
            __y_03._M_str = "error";
            __y_03._M_len = 5;
            bVar3 = std::operator==(sVar14,__y_03);
            if (bVar3) {
              severity = Error;
            }
            else {
              __y_04._M_str = "fatal";
              __y_04._M_len = 5;
              bVar3 = std::operator==(sVar14,__y_04);
              if (!bVar3) {
                SVar15 = Token::range(&pNVar8->name);
                this = local_70;
                addDiag(local_70,(DiagCode)0x1e0004,SVar15);
                pSVar13 = local_78;
                goto LAB_00185747;
              }
              severity = Fatal;
            }
          }
        }
        this = local_70;
        setDirective.this = local_70;
        setDirective.severity = &severity;
        this_03 = &pNVar8->value;
        pPVar9 = not_null<slang::syntax::PragmaExpressionSyntax_*>::get(this_03);
        if ((pPVar9->super_SyntaxNode).kind == ParenPragmaExpression) {
          pSVar5 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::get(this_03)->
                    super_SyntaxNode;
          pPVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                              (pSVar5);
          pSVar13 = local_78;
          __begin6.index = 0;
          sVar2 = (pPVar10->values).elements.size_;
          __begin6.list = &pPVar10->values;
          for (; (__begin6.list != &pPVar10->values || (__begin6.index != sVar2 + 1 >> 1));
              __begin6.index = __begin6.index + 1) {
            pPVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                     iterator_base<slang::syntax::PragmaExpressionSyntax_*>::operator*(&__begin6);
            applyDiagnosticPragma::anon_class_16_2_8b023938::operator()(&setDirective,pPVar9);
          }
        }
        else {
          pPVar9 = not_null<slang::syntax::PragmaExpressionSyntax_*>::get(this_03);
          applyDiagnosticPragma::anon_class_16_2_8b023938::operator()(&setDirective,pPVar9);
          pSVar13 = local_78;
        }
      }
      else if (pSVar5->kind == SimplePragmaExpression) {
        pSVar6 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>(pSVar5);
        this_00 = &pSVar6->value;
        sVar14 = Token::rawText(this_00);
        if ((pSVar6->value).kind == Identifier) {
          __y._M_str = "push";
          __y._M_len = 4;
          bVar3 = std::operator==(sVar14,__y);
          this = local_70;
          if (bVar3) {
            this_02 = local_70->sourceManager;
            SVar7 = Token::location(this_00);
            sStack_90 = 8;
            pcVar12 = "__push__";
          }
          else {
            if ((this_00->kind != Identifier) ||
               (__y_02._M_str = "pop", __y_02._M_len = 3, bVar3 = std::operator==(sVar14,__y_02),
               this = local_70, !bVar3)) goto LAB_00185622;
            this_02 = local_70->sourceManager;
            SVar7 = Token::location(this_00);
            sStack_90 = 7;
            pcVar12 = "__pop__";
          }
          sVar14._M_str = pcVar12;
          sVar14._M_len = sStack_90;
          SourceManager::addDiagnosticDirective(this_02,SVar7,sVar14,Ignored);
          pSVar13 = local_78;
        }
        else {
LAB_00185622:
          SVar15 = Token::range(this_00);
          this = local_70;
          this_01 = addDiag(local_70,(DiagCode)0x2a0004,SVar15);
          Diagnostic::operator<<(this_01,sVar14);
          pSVar13 = local_78;
        }
      }
      else {
        SVar15 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
        addDiag(this,(DiagCode)0x1d0004,SVar15);
      }
LAB_00185747:
      pIVar4 = (Info *)((long)&(last.info)->rawTextPtr + 1);
      last.info = pIVar4;
      pSVar11 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)last._0_8_;
    }
  }
  return;
}

Assistant:

void Preprocessor::applyDiagnosticPragma(const PragmaDirectiveSyntax& pragma) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedDiagPragmaArg, last.location() + last.rawText().length());
        return;
    }

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            string_view action = simple.value.rawText();
            if (simple.value.kind == TokenKind::Identifier && action == "push") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__push__",
                                                     DiagnosticSeverity::Ignored);
            }
            else if (simple.value.kind == TokenKind::Identifier && action == "pop") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__pop__",
                                                     DiagnosticSeverity::Ignored);
            }
            else {
                addDiag(diag::UnknownDiagPragmaArg, simple.value.range()) << action;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();

            DiagnosticSeverity severity;
            string_view text = nvp.name.valueText();
            if (text == "ignore")
                severity = DiagnosticSeverity::Ignored;
            else if (text == "warn")
                severity = DiagnosticSeverity::Warning;
            else if (text == "error")
                severity = DiagnosticSeverity::Error;
            else if (text == "fatal")
                severity = DiagnosticSeverity::Fatal;
            else {
                addDiag(diag::ExpectedDiagPragmaLevel, nvp.name.range());
                continue;
            }

            auto setDirective = [&](const PragmaExpressionSyntax& expr) {
                if (expr.kind == SyntaxKind::SimplePragmaExpression) {
                    auto& simple = expr.as<SimplePragmaExpressionSyntax>();
                    if (simple.value.kind == TokenKind::StringLiteral) {
                        sourceManager.addDiagnosticDirective(simple.value.location(),
                                                             simple.value.valueText(), severity);
                    }
                    else {
                        addDiag(diag::ExpectedDiagPragmaArg, simple.value.range());
                    }
                }
                else {
                    addDiag(diag::ExpectedDiagPragmaArg, expr.sourceRange());
                }
            };

            if (nvp.value->kind == SyntaxKind::ParenPragmaExpression) {
                auto& paren = nvp.value->as<ParenPragmaExpressionSyntax>();
                for (auto value : paren.values)
                    setDirective(*value);
            }
            else {
                setDirective(*nvp.value);
            }
        }
        else {
            addDiag(diag::ExpectedDiagPragmaArg, arg->sourceRange());
        }
    }
}